

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzclose.c
# Opt level: O0

int cm_zlib_gzclose(gzFile file)

{
  int local_24;
  gz_statep state;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -2;
  }
  else {
    if (file[1].have == 0x1c4f) {
      local_24 = cm_zlib_gzclose_r(file);
    }
    else {
      local_24 = cm_zlib_gzclose_w(file);
    }
    file_local._4_4_ = local_24;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzclose(file)
    gzFile file;
{
#ifndef NO_GZCOMPRESS
    gz_statep state;

    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    return state->mode == GZ_READ ? gzclose_r(file) : gzclose_w(file);
#else
    return gzclose_r(file);
#endif
}